

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O2

bool __thiscall
google::protobuf::util::MessageDifferencer::CompareWithFieldsInternal
          (MessageDifferencer *this,Message *message1,Message *message2,int unpacked_any,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *message1_fields,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *message2_fields,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  pointer *ppSVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  SpecificField *pSVar7;
  ulong uVar8;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  int iVar9;
  uint uVar10;
  int iVar11;
  Metadata MVar12;
  FieldDescriptor *field1;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_90;
  undefined4 local_84;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_80;
  FieldDescriptor *field2;
  int local_6c;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
  *local_68;
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_60;
  Reflection *local_58;
  Reflection *local_50;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
  local_48;
  undefined7 extraout_var;
  
  MVar12 = Message::GetMetadata(message1);
  local_50 = MVar12.reflection;
  MVar12 = Message::GetMetadata(message2);
  local_58 = MVar12.reflection;
  local_68 = (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
              *)&this->force_compare_no_presence_fields_;
  local_60 = &this->force_compare_failure_triggering_fields_;
  iVar9 = 0;
  local_84 = 0;
  iVar11 = 0;
  local_90 = message1_fields;
  local_80 = message2_fields;
LAB_002dcbf2:
  do {
    field1 = (message1_fields->
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_start[iVar11];
    field2 = (message2_fields->
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_start[iVar9];
    if (field1 == (FieldDescriptor *)0x0 && field2 == (FieldDescriptor *)0x0) {
      bVar4 = (byte)local_84 ^ 1;
LAB_002dd1d0:
      return (bool)(bVar4 & 1);
    }
    if (field1 == (FieldDescriptor *)0x0) {
      if (field2 == (FieldDescriptor *)0x0) {
LAB_002dce40:
        bVar2 = IsIgnored(this,message1,message2,field1,parent_fields);
        if (!bVar2) {
          if (field1 == (FieldDescriptor *)0x0) {
            __assert_fail("field1 != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/util/message_differencer.cc"
                          ,0x3d5,
                          "bool google::protobuf::util::MessageDifferencer::CompareWithFieldsInternal(const Message &, const Message &, int, const std::vector<const FieldDescriptor *> &, const std::vector<const FieldDescriptor *> &, std::vector<SpecificField> *)"
                         );
          }
          bVar2 = FieldDescriptor::is_map(field1);
          if (bVar2) {
            bVar2 = CompareMapField(this,message1,message2,unpacked_any,field1,parent_fields);
            uVar8 = CONCAT71(extraout_var_01,bVar2);
LAB_002dd065:
            message1_fields = local_90;
            if ((char)uVar8 == '\0') {
LAB_002dd06e:
              local_84 = (undefined4)CONCAT71((int7)(uVar8 >> 8),1);
              message1_fields = local_90;
              if (this->reporter_ == (Reporter *)0x0) goto LAB_002dd1ce;
            }
          }
          else {
            bVar2 = FieldDescriptor::is_repeated(field1);
            if (bVar2) {
              bVar2 = CompareRepeatedField(this,message1,message2,unpacked_any,field1,parent_fields)
              ;
              uVar8 = CONCAT71(extraout_var_02,bVar2);
              goto LAB_002dd065;
            }
            bVar2 = CompareFieldValueUsingParentFields
                              (this,message1,message2,unpacked_any,field1,-1,-1,parent_fields);
            bVar3 = absl::lts_20240722::container_internal::
                    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    ::contains<google::protobuf::FieldDescriptor_const*>(local_68,&field1);
            if (bVar3) {
              absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::
              emplace<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                        (&local_48,
                         &local_60->
                          super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ,field1->all_names_ + 1);
            }
            if (this->reporter_ != (Reporter *)0x0) {
              pSVar7 = PushSpecificField(parent_fields);
              pSVar7->message1 = message1;
              pSVar7->message2 = message2;
              pSVar7->unpacked_any = unpacked_any;
              pSVar7->field = field1;
              if (this->force_compare_no_presence_ == true) {
                bVar3 = absl::lts_20240722::container_internal::
                        raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
                        ::contains<google::protobuf::FieldDescriptor_const*>(local_68,&field1);
              }
              else {
                bVar3 = false;
              }
              message1_fields = local_90;
              pSVar7->forced_compare_no_presence_ = bVar3;
              if (bVar2) {
                if (this->report_matches_ == true) {
                  (*this->reporter_->_vptr_Reporter[6])
                            (this->reporter_,message1,message2,parent_fields);
                }
                ppSVar1 = &(parent_fields->
                           super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppSVar1 = *ppSVar1 + -1;
                message2_fields = local_80;
                goto LAB_002dd07f;
              }
              uVar5 = (*this->reporter_->_vptr_Reporter[4])
                                (this->reporter_,message1,message2,parent_fields);
              uVar8 = (ulong)uVar5;
              ppSVar1 = &(parent_fields->
                         super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppSVar1 = *ppSVar1 + -1;
              message2_fields = local_80;
              goto LAB_002dd06e;
            }
            message2_fields = local_80;
            message1_fields = local_90;
            if (!bVar2) goto LAB_002dd1ce;
          }
LAB_002dd07f:
          iVar9 = iVar9 + 1;
          iVar11 = iVar11 + 1;
          goto LAB_002dcbf2;
        }
        if (this->reporter_ != (Reporter *)0x0) {
          pSVar7 = PushSpecificField(parent_fields);
          pSVar7->message1 = message1;
          pSVar7->message2 = message2;
          pSVar7->unpacked_any = unpacked_any;
          pSVar7->field = field1;
          if (this->report_ignores_ == true) {
            (*this->reporter_->_vptr_Reporter[7])(this->reporter_,message1,message2,parent_fields);
          }
          ppSVar1 = &(parent_fields->
                     super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppSVar1 = *ppSVar1 + -1;
          message2_fields = local_80;
        }
        iVar11 = iVar11 + 1;
      }
      else {
LAB_002dcccf:
        bVar2 = IsIgnored(this,message1,message2,field2,parent_fields);
        if (!bVar2) {
          bVar2 = absl::lts_20240722::container_internal::
                  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  ::contains<google::protobuf::FieldDescriptor_const*>(local_68,&field2);
          if (bVar2) {
            absl::lts_20240722::container_internal::
            raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::
            emplace<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                      (&local_48,
                       &local_60->
                        super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ,field2->all_names_ + 1);
          }
          if (this->reporter_ == (Reporter *)0x0) goto LAB_002dd1ce;
          local_6c = iVar11;
          bVar2 = FieldDescriptor::is_repeated(field2);
          uVar8 = CONCAT71(extraout_var_00,bVar2);
          uVar5 = 1;
          if (bVar2) {
            uVar5 = Reflection::FieldSize(local_58,message2,field2);
            uVar8 = (ulong)uVar5;
          }
          uVar10 = 0;
          if ((int)uVar5 < 1) {
            uVar5 = 0;
          }
          for (; uVar5 != uVar10; uVar10 = uVar10 + 1) {
            pSVar7 = PushSpecificField(parent_fields);
            pSVar7->message1 = message1;
            pSVar7->message2 = message2;
            pSVar7->unpacked_any = unpacked_any;
            pSVar7->field = field2;
            bVar2 = FieldDescriptor::is_repeated(field2);
            if (bVar2) {
              pSVar7->index = uVar10;
              AddSpecificNewIndex(pSVar7,message2,field2,uVar10);
            }
            else {
              pSVar7->index = -1;
              pSVar7->new_index = -1;
            }
            if (this->force_compare_no_presence_ == true) {
              bVar2 = absl::lts_20240722::container_internal::
                      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
                      ::contains<google::protobuf::FieldDescriptor_const*>(local_68,&pSVar7->field);
            }
            else {
              bVar2 = false;
            }
            pSVar7->forced_compare_no_presence_ = bVar2;
            uVar6 = (*this->reporter_->_vptr_Reporter[2])
                              (this->reporter_,message1,message2,parent_fields);
            uVar8 = (ulong)uVar6;
            ppSVar1 = &(parent_fields->
                       super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppSVar1 = *ppSVar1 + -1;
          }
          iVar9 = iVar9 + 1;
          local_84 = (undefined4)CONCAT71((int7)(uVar8 >> 8),1);
          message2_fields = local_80;
          message1_fields = local_90;
          iVar11 = local_6c;
          goto LAB_002dcbf2;
        }
        if (this->reporter_ != (Reporter *)0x0) {
          pSVar7 = PushSpecificField(parent_fields);
          pSVar7->message1 = message1;
          pSVar7->message2 = message2;
          pSVar7->unpacked_any = unpacked_any;
          pSVar7->field = field2;
          if (this->report_ignores_ == true) {
            (*this->reporter_->_vptr_Reporter[7])(this->reporter_,message1,message2,parent_fields);
          }
          ppSVar1 = &(parent_fields->
                     super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppSVar1 = *ppSVar1 + -1;
          message2_fields = local_80;
        }
      }
      iVar9 = iVar9 + 1;
      message1_fields = local_90;
      goto LAB_002dcbf2;
    }
    if (field2 != (FieldDescriptor *)0x0) {
      if (field2->number_ <= field1->number_) {
        if (field1->number_ <= field2->number_) goto LAB_002dce40;
        goto LAB_002dcccf;
      }
    }
    bVar2 = IsIgnored(this,message1,message2,field1,parent_fields);
    if (bVar2) {
      if (this->reporter_ != (Reporter *)0x0) {
        pSVar7 = PushSpecificField(parent_fields);
        pSVar7->message1 = message1;
        pSVar7->message2 = message2;
        pSVar7->unpacked_any = unpacked_any;
        pSVar7->field = field1;
        if (this->report_ignores_ == true) {
          (*this->reporter_->_vptr_Reporter[7])(this->reporter_,message1,message2,parent_fields);
        }
        ppSVar1 = &(parent_fields->
                   super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + -1;
        message2_fields = local_80;
      }
      message1_fields = local_90;
      iVar11 = iVar11 + 1;
    }
    else {
      if (this->reporter_ == (Reporter *)0x0) {
LAB_002dd1ce:
        bVar4 = 0;
        goto LAB_002dd1d0;
      }
      if (field1 == (FieldDescriptor *)0x0) {
        __assert_fail("field1 != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/util/message_differencer.cc"
                      ,0x365,
                      "bool google::protobuf::util::MessageDifferencer::CompareWithFieldsInternal(const Message &, const Message &, int, const std::vector<const FieldDescriptor *> &, const std::vector<const FieldDescriptor *> &, std::vector<SpecificField> *)"
                     );
      }
      local_6c = iVar11;
      bVar2 = FieldDescriptor::is_repeated(field1);
      uVar8 = CONCAT71(extraout_var,bVar2);
      uVar5 = 1;
      if (bVar2) {
        uVar5 = Reflection::FieldSize(local_50,message1,field1);
        uVar8 = (ulong)uVar5;
      }
      uVar10 = 0;
      if ((int)uVar5 < 1) {
        uVar5 = uVar10;
      }
      for (; uVar5 != uVar10; uVar10 = uVar10 + 1) {
        pSVar7 = PushSpecificField(parent_fields);
        pSVar7->message1 = message1;
        pSVar7->message2 = message2;
        pSVar7->unpacked_any = unpacked_any;
        pSVar7->field = field1;
        bVar2 = FieldDescriptor::is_repeated(field1);
        if (bVar2) {
          AddSpecificIndex(pSVar7,message1,field1,uVar10);
        }
        else {
          pSVar7->index = -1;
        }
        uVar6 = (*this->reporter_->_vptr_Reporter[3])
                          (this->reporter_,message1,message2,parent_fields);
        uVar8 = (ulong)uVar6;
        ppSVar1 = &(parent_fields->
                   super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + -1;
      }
      local_84 = (undefined4)CONCAT71((int7)(uVar8 >> 8),1);
      message2_fields = local_80;
      message1_fields = local_90;
      iVar11 = local_6c + 1;
    }
  } while( true );
}

Assistant:

bool MessageDifferencer::CompareWithFieldsInternal(
    const Message& message1, const Message& message2, int unpacked_any,
    const std::vector<const FieldDescriptor*>& message1_fields,
    const std::vector<const FieldDescriptor*>& message2_fields,
    std::vector<SpecificField>* parent_fields) {
  bool isDifferent = false;
  int field_index1 = 0;
  int field_index2 = 0;

  const Reflection* reflection1 = message1.GetReflection();
  const Reflection* reflection2 = message2.GetReflection();

  while (true) {
    const FieldDescriptor* field1 = message1_fields[field_index1];
    const FieldDescriptor* field2 = message2_fields[field_index2];

    // Once we have reached sentinel values, we are done the comparison.
    if (field1 == NULL && field2 == NULL) {
      break;
    }

    // Check for differences in the field itself.
    if (FieldBefore(field1, field2)) {
      // Field 1 is not in the field list for message 2.
      if (IsIgnored(message1, message2, field1, *parent_fields)) {
        // We are ignoring field1. Report the ignore and move on to
        // the next field in message1_fields.
        if (reporter_ != NULL) {
          SpecificField& specific_field = PushSpecificField(parent_fields);
          specific_field.message1 = &message1;
          specific_field.message2 = &message2;
          specific_field.unpacked_any = unpacked_any;
          specific_field.field = field1;
          if (report_ignores_) {
            reporter_->ReportIgnored(message1, message2, *parent_fields);
          }
          parent_fields->pop_back();
        }
        ++field_index1;
        continue;
      }

      if (reporter_ != NULL) {
        assert(field1 != NULL);
        int count = field1->is_repeated()
                        ? reflection1->FieldSize(message1, field1)
                        : 1;

        for (int i = 0; i < count; ++i) {
          SpecificField& specific_field = PushSpecificField(parent_fields);
          specific_field.message1 = &message1;
          specific_field.message2 = &message2;
          specific_field.unpacked_any = unpacked_any;
          specific_field.field = field1;
          if (field1->is_repeated()) {
            AddSpecificIndex(&specific_field, message1, field1, i);
          } else {
            specific_field.index = -1;
          }

          reporter_->ReportDeleted(message1, message2, *parent_fields);
          parent_fields->pop_back();
        }

        isDifferent = true;
      } else {
        return false;
      }

      ++field_index1;
      continue;
    } else if (FieldBefore(field2, field1)) {
      const bool ignore_field =
          IsIgnored(message1, message2, field2, *parent_fields);
      if (!ignore_field && force_compare_no_presence_fields_.contains(field2)) {
        force_compare_failure_triggering_fields_.emplace(field2->full_name());
      }

      // Field 2 is not in the field list for message 1.
      if (ignore_field) {
        // We are ignoring field2. Report the ignore and move on to
        // the next field in message2_fields.
        if (reporter_ != NULL) {
          SpecificField& specific_field = PushSpecificField(parent_fields);
          specific_field.message1 = &message1;
          specific_field.message2 = &message2;
          specific_field.unpacked_any = unpacked_any;
          specific_field.field = field2;
          if (report_ignores_) {
            reporter_->ReportIgnored(message1, message2, *parent_fields);
          }
          parent_fields->pop_back();
        }
        ++field_index2;
        continue;
      }

      if (reporter_ != NULL) {
        int count = field2->is_repeated()
                        ? reflection2->FieldSize(message2, field2)
                        : 1;

        for (int i = 0; i < count; ++i) {
          SpecificField& specific_field = PushSpecificField(parent_fields);
          specific_field.message1 = &message1,
          specific_field.message2 = &message2;
          specific_field.unpacked_any = unpacked_any;
          specific_field.field = field2;
          if (field2->is_repeated()) {
            specific_field.index = i;
            AddSpecificNewIndex(&specific_field, message2, field2, i);
          } else {
            specific_field.index = -1;
            specific_field.new_index = -1;
          }

          specific_field.forced_compare_no_presence_ =
              force_compare_no_presence_ &&
              force_compare_no_presence_fields_.contains(specific_field.field);

          reporter_->ReportAdded(message1, message2, *parent_fields);
          parent_fields->pop_back();
        }

        isDifferent = true;
      } else {
        return false;
      }

      ++field_index2;
      continue;
    }

    // By this point, field1 and field2 are guaranteed to point to the same
    // field, so we can now compare the values.
    if (IsIgnored(message1, message2, field1, *parent_fields)) {
      // Ignore this field. Report and move on.
      if (reporter_ != NULL) {
        SpecificField& specific_field = PushSpecificField(parent_fields);
        specific_field.message1 = &message1;
        specific_field.message2 = &message2;
        specific_field.unpacked_any = unpacked_any;
        specific_field.field = field1;
        if (report_ignores_) {
          reporter_->ReportIgnored(message1, message2, *parent_fields);
        }
        parent_fields->pop_back();
      }

      ++field_index1;
      ++field_index2;
      continue;
    }

    bool fieldDifferent = false;
    assert(field1 != NULL);
    if (field1->is_map()) {
      fieldDifferent = !CompareMapField(message1, message2, unpacked_any,
                                        field1, parent_fields);
    } else if (field1->is_repeated()) {
      fieldDifferent = !CompareRepeatedField(message1, message2, unpacked_any,
                                             field1, parent_fields);
    } else {
      fieldDifferent = !CompareFieldValueUsingParentFields(
          message1, message2, unpacked_any, field1, -1, -1, parent_fields);

      if (force_compare_no_presence_fields_.contains(field1)) {
        force_compare_failure_triggering_fields_.emplace(field1->full_name());
      }

      if (reporter_ != nullptr) {
        SpecificField& specific_field = PushSpecificField(parent_fields);
        specific_field.message1 = &message1;
        specific_field.message2 = &message2;
        specific_field.unpacked_any = unpacked_any;
        specific_field.field = field1;
        specific_field.forced_compare_no_presence_ =
            force_compare_no_presence_ &&
            force_compare_no_presence_fields_.contains(field1);

        if (fieldDifferent) {
          reporter_->ReportModified(message1, message2, *parent_fields);
          isDifferent = true;
        } else if (report_matches_) {
          reporter_->ReportMatched(message1, message2, *parent_fields);
        }
        parent_fields->pop_back();
      }
    }
    if (fieldDifferent) {
      if (reporter_ == nullptr) return false;
      isDifferent = true;
    }
    // Increment the field indices.
    ++field_index1;
    ++field_index2;
  }

  return !isDifferent;
}